

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nng.c
# Opt level: O3

int nng_send(nng_socket s,void *buf,size_t len,int flags)

{
  int iVar1;
  nni_msg *in_RAX;
  void *__dest;
  nni_msg *local_38;
  nng_msg *msg;
  
  local_38 = in_RAX;
  iVar1 = nni_msg_alloc(&local_38,len);
  if (iVar1 == 0) {
    __dest = nni_msg_body(local_38);
    memcpy(__dest,buf,len);
    iVar1 = nng_sendmsg(s,local_38,flags);
    if (iVar1 == 0) {
      iVar1 = 0;
    }
    else {
      nni_msg_free(local_38);
    }
  }
  return iVar1;
}

Assistant:

int
nng_send(nng_socket s, void *buf, size_t len, int flags)
{
	nng_msg *msg;
	int      rv;

	if ((rv = nng_msg_alloc(&msg, len)) != 0) {
		return (rv);
	}
	memcpy(nng_msg_body(msg), buf, len);
	if ((rv = nng_sendmsg(s, msg, flags)) != 0) {
		// If nng_sendmsg() succeeded, then it took ownership.
		nng_msg_free(msg);
	}
	return (rv);
}